

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

iter_result_opt * __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::lte_key_byte(iter_result_opt *__return_storage_ptr__,
              basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              *this,byte key_byte)

{
  uchar uVar1;
  in_fake_critical_section *this_00;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *this_01;
  iter_result<unodb::detail::node_header> local_40;
  byte local_22;
  uint8_t local_21;
  byte key;
  ulong uStack_20;
  uint8_t child_index;
  int64_t i;
  basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbStack_10;
  byte key_byte_local;
  basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  
  uStack_20 = (ulong)key_byte;
  i._7_1_ = key_byte;
  pbStack_10 = this;
  while( true ) {
    if ((long)uStack_20 < 0) {
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.node.tagged_ptr = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload + 8) = 0;
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.prefix = (key_prefix_snapshot)0;
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_engaged = false;
      *(undefined7 *)
       &(__return_storage_ptr__->
        super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
        field_0x19 = 0;
      return __return_storage_ptr__;
    }
    local_21 = (uint8_t)uStack_20;
    this_00 = (in_fake_critical_section *)
              std::array<unodb::in_fake_critical_section<unsigned_char>,_256UL>::operator[]
                        (&this->child_indexes,uStack_20 & 0xff);
    uVar1 = in_fake_critical_section::operator_cast_to_unsigned_char(this_00);
    if (uVar1 != 0xff) break;
    uStack_20 = uStack_20 - 1;
  }
  local_22 = (byte)uStack_20;
  basic_node_ptr<unodb::detail::node_header>::basic_node_ptr(&local_40.node,(header_type *)this,I48)
  ;
  local_40.key_byte = local_22;
  local_40.child_index = local_21;
  this_01 = basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
            ::get_key_prefix((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                              *)this);
  local_40.prefix =
       key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
       ::get_snapshot((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                       *)&this_01->f);
  std::optional<unodb::detail::iter_result<unodb::detail::node_header>_>::
  optional<unodb::detail::iter_result<unodb::detail::node_header>,_true>
            (__return_storage_ptr__,&local_40);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_48::iter_result_opt
  lte_key_byte(std::byte key_byte) noexcept {
    // loop over the prior byte values in lexical order.
    for (auto i = static_cast<std::int64_t>(key_byte); i >= 0; i--) {
      const auto child_index = static_cast<std::uint8_t>(i);
      if (child_indexes[child_index] != empty_child) {
        const auto key = static_cast<std::byte>(i);
        return {{node_ptr{this, node_type::I48}, key, child_index,
                 this->get_key_prefix().get_snapshot()}};
      }
    }
    return parent_class::end_result;
  }